

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_375::NinjaMain::OpenDepsLog(NinjaMain *this,bool recompact_only)

{
  bool bVar1;
  LoadStatus LVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool success;
  undefined1 local_b8 [4];
  LoadStatus status;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string path;
  bool recompact_only_local;
  NinjaMain *this_local;
  
  path.field_2._M_local_buf[0xf] = recompact_only;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,".ninja_deps",&local_41);
  std::allocator<char>::~allocator(&local_41);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err.field_2 + 8),&this->build_dir_,"/");
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)local_b8);
  LVar2 = DepsLog::Load(&this->deps_log_,(string *)local_40,&this->state_,(string *)local_b8);
  if (LVar2 == LOAD_ERROR) {
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    Error("loading deps log %s: %s",uVar4,uVar5);
    this_local._7_1_ = false;
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      uVar4 = std::__cxx11::string::c_str();
      Warning("%s",uVar4);
      std::__cxx11::string::clear();
    }
    if ((path.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (((this->config_->dry_run & 1U) != 0) ||
         (bVar1 = DepsLog::OpenForWrite(&this->deps_log_,(string *)local_40,(string *)local_b8),
         bVar1)) {
        this_local._7_1_ = true;
      }
      else {
        uVar4 = std::__cxx11::string::c_str();
        Error("opening deps log: %s",uVar4);
        this_local._7_1_ = false;
      }
    }
    else if (LVar2 == LOAD_NOT_FOUND) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = DepsLog::Recompact(&this->deps_log_,(string *)local_40,(string *)local_b8);
      if (!this_local._7_1_) {
        uVar4 = std::__cxx11::string::c_str();
        Error("failed recompaction: %s",uVar4);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool NinjaMain::OpenDepsLog(bool recompact_only) {
  string path = ".ninja_deps";
  if (!build_dir_.empty())
    path = build_dir_ + "/" + path;

  string err;
  const LoadStatus status = deps_log_.Load(path, &state_, &err);
  if (status == LOAD_ERROR) {
    Error("loading deps log %s: %s", path.c_str(), err.c_str());
    return false;
  }
  if (!err.empty()) {
    // Hack: Load() can return a warning via err by returning LOAD_SUCCESS.
    Warning("%s", err.c_str());
    err.clear();
  }

  if (recompact_only) {
    if (status == LOAD_NOT_FOUND) {
      return true;
    }
    bool success = deps_log_.Recompact(path, &err);
    if (!success)
      Error("failed recompaction: %s", err.c_str());
    return success;
  }

  if (!config_.dry_run) {
    if (!deps_log_.OpenForWrite(path, &err)) {
      Error("opening deps log: %s", err.c_str());
      return false;
    }
  }

  return true;
}